

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O1

UBool repTextAccess(UText *ut,int64_t index,UBool forward)

{
  long *plVar1;
  UChar *buff;
  int iVar2;
  long lVar3;
  int64_t iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  UnicodeString buffer;
  UnicodeString local_70;
  
  plVar1 = (long *)ut->context;
  iVar2 = (**(code **)(*plVar1 + 0x40))(plVar1);
  lVar7 = (long)iVar2;
  iVar4 = index;
  if (lVar7 < index) {
    iVar4 = lVar7;
  }
  lVar6 = 0;
  if (-1 < index) {
    lVar6 = iVar4;
  }
  iVar8 = (int)lVar6;
  lVar5 = (long)iVar8;
  lVar3 = ut->chunkNativeStart;
  if (forward == '\0') {
    if ((lVar3 < lVar5) && (lVar5 <= ut->chunkNativeLimit)) goto LAB_002f65ec;
    if (lVar3 == 0 && iVar8 == 0) {
      ut->chunkOffset = 0;
      return '\0';
    }
    lVar3 = 0;
    if (8 < iVar8) {
      lVar3 = (lVar6 << 0x20) + -0x900000000 >> 0x20;
    }
    ut->chunkNativeStart = lVar3;
    lVar6 = (lVar6 << 0x20) + 0x100000000 >> 0x20;
    if (iVar2 <= iVar8) {
      lVar6 = lVar7;
    }
    ut->chunkNativeLimit = lVar6;
  }
  else {
    if ((lVar3 <= lVar5) && (lVar5 < ut->chunkNativeLimit)) {
LAB_002f65ec:
      ut->chunkOffset = iVar8 - (int)lVar3;
      return '\x01';
    }
    if ((iVar2 <= iVar8) && (ut->chunkNativeLimit == lVar7)) {
      ut->chunkOffset = iVar2 - (int)lVar3;
      return '\0';
    }
    lVar3 = lVar6 + 9;
    if (lVar7 <= lVar6 + 9) {
      lVar3 = lVar7;
    }
    ut->chunkNativeLimit = lVar3;
    lVar6 = 0;
    if (9 < lVar3) {
      lVar6 = lVar3 + -10;
    }
    ut->chunkNativeStart = lVar6;
  }
  buff = (UChar *)ut->pExtra;
  icu_63::UnicodeString::UnicodeString(&local_70,buff,0,10);
  (**(code **)(*plVar1 + 0x18))
            (plVar1,(int)ut->chunkNativeStart,(int)ut->chunkNativeLimit,&local_70);
  ut->chunkContents = buff;
  lVar6 = ut->chunkNativeLimit;
  lVar3 = ut->chunkNativeStart;
  iVar2 = (int)lVar6 - (int)lVar3;
  ut->chunkLength = iVar2;
  iVar8 = iVar8 - (int)lVar3;
  ut->chunkOffset = iVar8;
  if ((lVar6 < lVar7) && ((buff[(long)iVar2 + -1] & 0xfc00U) == 0xd800)) {
    ut->chunkLength = iVar2 + -1;
    ut->chunkNativeLimit = lVar6 + -1;
    if (iVar2 <= iVar8) {
      ut->chunkOffset = iVar2 + -1;
    }
  }
  if ((0 < lVar3) && ((*buff & 0xfc00U) == 0xdc00)) {
    ut->chunkContents = buff + 1;
    ut->chunkNativeStart = lVar3 + 1;
    ut->chunkLength = ut->chunkLength + -1;
    ut->chunkOffset = ut->chunkOffset + -1;
  }
  lVar7 = (long)ut->chunkOffset;
  if (((0 < lVar7) && ((ut->chunkContents[lVar7] & 0xfc00U) == 0xdc00)) &&
     ((ut->chunkContents[lVar7 + -1] & 0xfc00U) == 0xd800)) {
    ut->chunkOffset = ut->chunkOffset + -1;
  }
  ut->nativeIndexingLimit = ut->chunkLength;
  icu_63::UnicodeString::~UnicodeString(&local_70);
  return '\x01';
}

Assistant:

static UBool U_CALLCONV
repTextAccess(UText *ut, int64_t index, UBool forward) {
    const Replaceable *rep=(const Replaceable *)ut->context;
    int32_t length=rep->length();   // Full length of the input text (bigger than a chunk)

    // clip the requested index to the limits of the text.
    int32_t index32 = pinIndex(index, length);
    U_ASSERT(index<=INT32_MAX);


    /*
     * Compute start/limit boundaries around index, for a segment of text
     * to be extracted.
     * To allow for the possibility that our user gave an index to the trailing
     * half of a surrogate pair, we must request one extra preceding UChar when
     * going in the forward direction.  This will ensure that the buffer has the
     * entire code point at the specified index.
     */
    if(forward) {

        if (index32>=ut->chunkNativeStart && index32<ut->chunkNativeLimit) {
            // Buffer already contains the requested position.
            ut->chunkOffset = (int32_t)(index - ut->chunkNativeStart);
            return TRUE;
        }
        if (index32>=length && ut->chunkNativeLimit==length) {
            // Request for end of string, and buffer already extends up to it.
            // Can't get the data, but don't change the buffer.
            ut->chunkOffset = length - (int32_t)ut->chunkNativeStart;
            return FALSE;
        }

        ut->chunkNativeLimit = index + REP_TEXT_CHUNK_SIZE - 1;
        // Going forward, so we want to have the buffer with stuff at and beyond
        //   the requested index.  The -1 gets us one code point before the
        //   requested index also, to handle the case of the index being on
        //   a trail surrogate of a surrogate pair.
        if(ut->chunkNativeLimit > length) {
            ut->chunkNativeLimit = length;
        }
        // unless buffer ran off end, start is index-1.
        ut->chunkNativeStart = ut->chunkNativeLimit - REP_TEXT_CHUNK_SIZE;
        if(ut->chunkNativeStart < 0) {
            ut->chunkNativeStart = 0;
        }
    } else {
        // Reverse iteration.  Fill buffer with data preceding the requested index.
        if (index32>ut->chunkNativeStart && index32<=ut->chunkNativeLimit) {
            // Requested position already in buffer.
            ut->chunkOffset = index32 - (int32_t)ut->chunkNativeStart;
            return TRUE;
        }
        if (index32==0 && ut->chunkNativeStart==0) {
            // Request for start, buffer already begins at start.
            //  No data, but keep the buffer as is.
            ut->chunkOffset = 0;
            return FALSE;
        }

        // Figure out the bounds of the chunk to extract for reverse iteration.
        // Need to worry about chunk not splitting surrogate pairs, and while still
        // containing the data we need.
        // Fix by requesting a chunk that includes an extra UChar at the end.
        // If this turns out to be a lead surrogate, we can lop it off and still have
        //   the data we wanted.
        ut->chunkNativeStart = index32 + 1 - REP_TEXT_CHUNK_SIZE;
        if (ut->chunkNativeStart < 0) {
            ut->chunkNativeStart = 0;
        }

        ut->chunkNativeLimit = index32 + 1;
        if (ut->chunkNativeLimit > length) {
            ut->chunkNativeLimit = length;
        }
    }

    // Extract the new chunk of text from the Replaceable source.
    ReplExtra *ex = (ReplExtra *)ut->pExtra;
    // UnicodeString with its buffer a writable alias to the chunk buffer
    UnicodeString buffer(ex->s, 0 /*buffer length*/, REP_TEXT_CHUNK_SIZE /*buffer capacity*/);
    rep->extractBetween((int32_t)ut->chunkNativeStart, (int32_t)ut->chunkNativeLimit, buffer);

    ut->chunkContents  = ex->s;
    ut->chunkLength    = (int32_t)(ut->chunkNativeLimit - ut->chunkNativeStart);
    ut->chunkOffset    = (int32_t)(index32 - ut->chunkNativeStart);

    // Surrogate pairs from the input text must not span chunk boundaries.
    // If end of chunk could be the start of a surrogate, trim it off.
    if (ut->chunkNativeLimit < length &&
        U16_IS_LEAD(ex->s[ut->chunkLength-1])) {
            ut->chunkLength--;
            ut->chunkNativeLimit--;
            if (ut->chunkOffset > ut->chunkLength) {
                ut->chunkOffset = ut->chunkLength;
            }
        }

    // if the first UChar in the chunk could be the trailing half of a surrogate pair,
    // trim it off.
    if(ut->chunkNativeStart>0 && U16_IS_TRAIL(ex->s[0])) {
        ++(ut->chunkContents);
        ++(ut->chunkNativeStart);
        --(ut->chunkLength);
        --(ut->chunkOffset);
    }

    // adjust the index/chunkOffset to a code point boundary
    U16_SET_CP_START(ut->chunkContents, 0, ut->chunkOffset);

    // Use fast indexing for get/setNativeIndex()
    ut->nativeIndexingLimit = ut->chunkLength;

    return TRUE;
}